

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-death.c
# Opt level: O3

void death_file(char *title,wchar_t row)

{
  _Bool _Var1;
  char *fmt;
  char ftmp [80];
  char buf [1024];
  char acStack_458 [80];
  char local_408 [1024];
  
  player_safe_name(acStack_458,0x50,player->full_name,false);
  my_strcat(acStack_458,".txt",0x50);
  _Var1 = (*get_file)(acStack_458,local_408,0x400);
  if (_Var1) {
    screen_save();
    _Var1 = dump_save(local_408);
    screen_load();
    fmt = "Character dump failed!";
    if (_Var1) {
      fmt = "Character dump successful.";
    }
    msg(fmt);
    event_signal(EVENT_MESSAGE_FLUSH);
  }
  return;
}

Assistant:

static void death_file(const char *title, int row)
{
	char buf[1024];
	char ftmp[80];

	/* Get the filesystem-safe name and append .txt */
	player_safe_name(ftmp, sizeof(ftmp), player->full_name, false);
	my_strcat(ftmp, ".txt", sizeof(ftmp));

	if (get_file(ftmp, buf, sizeof buf)) {
		bool success;

		/* Dump a character file */
		screen_save();
		success = dump_save(buf);
		screen_load();

		/* Check result */
		if (success)
			msg("Character dump successful.");
		else
			msg("Character dump failed!");

		/* Flush messages */
		event_signal(EVENT_MESSAGE_FLUSH);
	}
}